

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# writer2.c
# Opt level: O2

ktx_error_code_e ktxTexture2_DeflateZLIB(ktxTexture2 *This,ktx_uint32_t compressionLevel)

{
  ktxTexture2_private *pkVar1;
  ulong uVar2;
  ktx_error_code_e kVar3;
  ktx_size_t kVar4;
  void *__ptr;
  ulong uVar5;
  ktx_uint8_t *__dest;
  size_t sVar6;
  uint uVar7;
  long lVar8;
  ktxLevelIndexEntry *__dest_00;
  size_t __size;
  ktx_uint32_t kVar9;
  ulong uVar10;
  long lVar11;
  size_t levelByteLengthCmp;
  ulong local_40;
  ulong local_38;
  
  if (This->supercompressionScheme == KTX_SS_BEGIN_RANGE) {
    kVar9 = This->numLevels;
    uVar7 = kVar9 * 0x18;
    pkVar1 = This->_private;
    __dest_00 = pkVar1->_levelIndex;
    sVar6 = 0;
    while (kVar9 = kVar9 - 1, -1 < (int)kVar9) {
      kVar4 = ktxCompressZLIBBounds(pkVar1->_levelIndex[kVar9 & 0x7fffffff].byteLength);
      sVar6 = sVar6 + kVar4;
    }
    uVar10 = (ulong)uVar7;
    __ptr = malloc(sVar6 + uVar10);
    kVar3 = KTX_OUT_OF_MEMORY;
    if (__ptr != (void *)0x0) {
      lVar8 = 0;
      __size = 0;
      uVar2 = (ulong)This->numLevels;
      local_40 = uVar10;
      while( true ) {
        uVar7 = (uint)(uVar2 - 1);
        if ((int)uVar7 < 0) break;
        uVar5 = (ulong)(uVar7 & 0x7fffffff);
        lVar11 = uVar5 * 0x18;
        levelByteLengthCmp = sVar6;
        local_38 = uVar2 - 1;
        kVar3 = ktxCompressZLIBInt((uchar *)((long)((long)__ptr + uVar10) + lVar8),
                                   &levelByteLengthCmp,This->pData + __dest_00[uVar5].byteOffset,
                                   pkVar1->_levelIndex[uVar5].byteLength,compressionLevel);
        if (kVar3 != KTX_SUCCESS) {
          free(__ptr);
          return kVar3;
        }
        *(long *)((long)__ptr + lVar11) = lVar8;
        *(ktx_uint64_t *)((long)__ptr + lVar11 + 0x10) = __dest_00[uVar5].byteLength;
        *(size_t *)((long)__ptr + lVar11 + 8) = levelByteLengthCmp;
        __size = __size + levelByteLengthCmp;
        lVar8 = lVar8 + levelByteLengthCmp;
        sVar6 = sVar6 - levelByteLengthCmp;
        uVar2 = local_38;
      }
      __dest = (ktx_uint8_t *)malloc(__size);
      if (__dest == (ktx_uint8_t *)0x0) {
        free(__ptr);
        kVar3 = KTX_OUT_OF_MEMORY;
      }
      else {
        memcpy(__dest,(void *)((long)__ptr + uVar10),__size);
        memcpy(__dest_00,__ptr,local_40);
        free(__ptr);
        free(This->pData);
        This->pData = __dest;
        This->dataSize = __size;
        This->supercompressionScheme = KTX_SS_END_RANGE;
        This->_private->_requiredLevelAlignment = 1;
        kVar3 = KTX_SUCCESS;
      }
    }
  }
  else {
    kVar3 = KTX_INVALID_OPERATION;
  }
  return kVar3;
}

Assistant:

KTX_error_code
ktxTexture2_DeflateZLIB(ktxTexture2* This, ktx_uint32_t compressionLevel)
{
    ktx_uint32_t levelIndexByteLength =
                            This->numLevels * sizeof(ktxLevelIndexEntry);
    ktx_uint8_t* workBuf;
    ktx_uint8_t* cmpData;
    ktx_size_t dstRemainingByteLength = 0;
    ktx_size_t byteLengthCmp = 0;
    ktx_size_t levelOffset = 0;
    ktxLevelIndexEntry* cindex = This->_private->_levelIndex;
    ktxLevelIndexEntry* nindex;
    ktx_uint8_t* pCmpDst;

    if (This->supercompressionScheme != KTX_SS_NONE)
        return KTX_INVALID_OPERATION;

    // On rare occasions the deflated data can be a few bytes larger than
    // the source data. Calculating the dst buffer size using
    // mz_deflateBound provides a conservative size to account for that.
    for (int32_t level = This->numLevels - 1; level >= 0; level--) {
        dstRemainingByteLength += ktxCompressZLIBBounds(cindex[level].byteLength);
    }

    workBuf = malloc(dstRemainingByteLength + levelIndexByteLength);
    if (workBuf == NULL)
        return KTX_OUT_OF_MEMORY;
    nindex = (ktxLevelIndexEntry*)workBuf;
    pCmpDst = &workBuf[levelIndexByteLength];

    for (int32_t level = This->numLevels - 1; level >= 0; level--) {
        size_t levelByteLengthCmp = dstRemainingByteLength;
        KTX_error_code result = ktxCompressZLIBInt(pCmpDst + levelOffset,
                                                    &levelByteLengthCmp,
                                                    &This->pData[cindex[level].byteOffset],
                                                    cindex[level].byteLength,
                                                    compressionLevel);
        if (result != KTX_SUCCESS) {
            free(workBuf);
            return result;
        }

        nindex[level].byteOffset = levelOffset;
        nindex[level].uncompressedByteLength = cindex[level].byteLength;
        nindex[level].byteLength = levelByteLengthCmp;
        byteLengthCmp += levelByteLengthCmp;
        levelOffset += levelByteLengthCmp;
        dstRemainingByteLength -= levelByteLengthCmp;
    }

    // Move the compressed data into a correctly sized buffer.
    cmpData = malloc(byteLengthCmp);
    if (cmpData == NULL) {
        free(workBuf);
        return KTX_OUT_OF_MEMORY;
    }
    // Now modify the texture.
    memcpy(cmpData, pCmpDst, byteLengthCmp); // Copy data to sized buffer.
    memcpy(cindex, nindex, levelIndexByteLength); // Update level index
    free(workBuf);
    free(This->pData);
    This->pData = cmpData;
    This->dataSize = byteLengthCmp;
    This->supercompressionScheme = KTX_SS_ZLIB;
    This->_private->_requiredLevelAlignment = 1;

    return KTX_SUCCESS;
}